

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::InputScalarEx
               (char *label,ImGuiDataType data_type,void *data_ptr,void *step_ptr,
               void *step_fast_ptr,char *scalar_format,ImGuiInputTextFlags extra_flags)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  float *pfVar7;
  ImVec2 IVar8;
  float fVar9;
  float fVar10;
  ImVec2 label_size;
  char buf [64];
  ImVec2 local_a0;
  float *local_98;
  ImVec2 local_90;
  undefined1 local_88 [16];
  char local_78 [72];
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (pIVar1->SkipItems == false) {
    local_98 = (float *)step_fast_ptr;
    local_90 = CalcTextSize(label,(char *)0x0,true,-1.0);
    BeginGroup();
    PushID(label);
    fVar10 = (pIVar3->Style).FramePadding.x;
    fVar9 = (pIVar3->Style).FramePadding.y;
    local_a0.y = fVar9 + fVar9 + pIVar3->FontSize;
    local_a0.x = fVar10 + fVar10 + pIVar3->FontSize;
    if (step_ptr != (void *)0x0) {
      fVar10 = (GImGui->CurrentWindow->DC).ItemWidth;
      if (fVar10 < 0.0) {
        local_88 = ZEXT416((uint)fVar10);
        IVar8 = GetContentRegionAvail();
        fVar9 = (float)local_88._0_4_ + IVar8.x;
        fVar10 = 1.0;
        if (1.0 <= fVar9) {
          fVar10 = fVar9;
        }
      }
      fVar9 = local_a0.x + (pIVar3->Style).ItemInnerSpacing.x;
      fVar9 = (float)(int)fVar10 - (fVar9 + fVar9);
      fVar10 = 1.0;
      if (1.0 <= fVar9) {
        fVar10 = fVar9;
      }
      PushItemWidth(fVar10);
    }
    local_88._0_8_ = label;
    if (data_type == ImGuiDataType_Float) {
      ImFormatString(local_78,0x40,scalar_format,(double)*data_ptr);
    }
    else if (data_type == ImGuiDataType_Int) {
      ImFormatString(local_78,0x40,scalar_format,(ulong)*data_ptr);
    }
    bVar6 = false;
    bVar5 = InputText("",local_78,0x40,(uint)((extra_flags & 2U) == 0) | extra_flags | 0x10,
                      (ImGuiTextEditCallback)0x0,(void *)0x0);
    if (bVar5) {
      bVar6 = DataTypeApplyOpFromText
                        (local_78,(GImGui->InputTextState).InitialText.Data,data_type,data_ptr,
                         scalar_format);
    }
    if (step_ptr != (void *)0x0) {
      PopItemWidth();
      pIVar4 = GImGui;
      fVar10 = (pIVar3->Style).ItemInnerSpacing.x;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->Accessed = true;
      if (pIVar2->SkipItems == false) {
        if (fVar10 < 0.0) {
          fVar10 = (pIVar4->Style).ItemSpacing.x;
        }
        (pIVar2->DC).CursorPos.x = fVar10 + (pIVar2->DC).CursorPosPrevLine.x;
        (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
        (pIVar2->DC).CurrentLineHeight = (pIVar2->DC).PrevLineHeight;
        (pIVar2->DC).CurrentLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      }
      bVar5 = ButtonEx("-",&local_a0,0x41);
      if (bVar5) {
        pfVar7 = (float *)step_ptr;
        if ((pIVar3->IO).KeyCtrl != false) {
          pfVar7 = local_98;
        }
        if (local_98 == (float *)0x0) {
          pfVar7 = (float *)step_ptr;
        }
        bVar6 = true;
        if (data_type == ImGuiDataType_Float) {
          *(float *)data_ptr = *data_ptr - *pfVar7;
        }
        else if (data_type == ImGuiDataType_Int) {
          *(int *)data_ptr = *data_ptr - (int)*pfVar7;
        }
      }
      pIVar4 = GImGui;
      fVar10 = (pIVar3->Style).ItemInnerSpacing.x;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->Accessed = true;
      if (pIVar2->SkipItems == false) {
        if (fVar10 < 0.0) {
          fVar10 = (pIVar4->Style).ItemSpacing.x;
        }
        (pIVar2->DC).CursorPos.x = fVar10 + (pIVar2->DC).CursorPosPrevLine.x;
        (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
        (pIVar2->DC).CurrentLineHeight = (pIVar2->DC).PrevLineHeight;
        (pIVar2->DC).CurrentLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      }
      bVar5 = ButtonEx("+",&local_a0,0x41);
      if (bVar5) {
        pfVar7 = (float *)step_ptr;
        if ((pIVar3->IO).KeyCtrl != false) {
          pfVar7 = local_98;
        }
        if (local_98 == (float *)0x0) {
          pfVar7 = (float *)step_ptr;
        }
        bVar6 = true;
        if (data_type == ImGuiDataType_Float) {
          *(float *)data_ptr = *data_ptr + *pfVar7;
        }
        else if (data_type == ImGuiDataType_Int) {
          *(int *)data_ptr = *data_ptr + (int)*pfVar7;
        }
      }
    }
    PopID();
    pIVar4 = GImGui;
    if (0.0 < local_90.x) {
      fVar10 = (pIVar3->Style).ItemInnerSpacing.x;
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->Accessed = true;
      if (pIVar2->SkipItems == false) {
        if (fVar10 < 0.0) {
          fVar10 = (pIVar4->Style).ItemSpacing.x;
        }
        (pIVar2->DC).CursorPos.x = fVar10 + (pIVar2->DC).CursorPosPrevLine.x;
        (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
        (pIVar2->DC).CurrentLineHeight = (pIVar2->DC).PrevLineHeight;
        (pIVar2->DC).CurrentLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      }
      IVar8.y = (pIVar1->DC).CursorPos.y + (pIVar3->Style).FramePadding.y;
      IVar8.x = (pIVar1->DC).CursorPos.x;
      RenderText(IVar8,(char *)local_88._0_8_,(char *)0x0,true);
      ItemSize(&local_90,(pIVar3->Style).FramePadding.y);
    }
    EndGroup();
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui::InputScalarEx(const char* label, ImGuiDataType data_type, void* data_ptr, void* step_ptr, void* step_fast_ptr, const char* scalar_format, ImGuiInputTextFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    BeginGroup();
    PushID(label);
    const ImVec2 button_sz = ImVec2(g.FontSize, g.FontSize) + style.FramePadding*2.0f;
    if (step_ptr)
        PushItemWidth(ImMax(1.0f, CalcItemWidth() - (button_sz.x + style.ItemInnerSpacing.x)*2));

    char buf[64];
    DataTypeFormatString(data_type, data_ptr, scalar_format, buf, IM_ARRAYSIZE(buf));

    bool value_changed = false;
    if (!(extra_flags & ImGuiInputTextFlags_CharsHexadecimal))
        extra_flags |= ImGuiInputTextFlags_CharsDecimal;
    extra_flags |= ImGuiInputTextFlags_AutoSelectAll;
    if (InputText("", buf, IM_ARRAYSIZE(buf), extra_flags)) // PushId(label) + "" gives us the expected ID from outside point of view
        value_changed = DataTypeApplyOpFromText(buf, GImGui->InputTextState.InitialText.begin(), data_type, data_ptr, scalar_format);

    // Step buttons
    if (step_ptr)
    {
        PopItemWidth();
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", button_sz, ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups))
        {
            DataTypeApplyOp(data_type, '-', data_ptr, g.IO.KeyCtrl && step_fast_ptr ? step_fast_ptr : step_ptr);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", button_sz, ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups))
        {
            DataTypeApplyOp(data_type, '+', data_ptr, g.IO.KeyCtrl && step_fast_ptr ? step_fast_ptr : step_ptr);
            value_changed = true;
        }
    }
    PopID();

    if (label_size.x > 0)
    {
        SameLine(0, style.ItemInnerSpacing.x);
        RenderText(ImVec2(window->DC.CursorPos.x, window->DC.CursorPos.y + style.FramePadding.y), label);
        ItemSize(label_size, style.FramePadding.y);
    }
    EndGroup();

    return value_changed;
}